

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

pair<cmQtAutoGen::IntegerVersion,_unsigned_int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget *target)

{
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar1;
  cmGeneratorTarget *this;
  value_type vVar2;
  bool bVar3;
  char *input;
  reference pvVar4;
  reference pIVar5;
  uint local_c8;
  IntegerVersion it;
  iterator __end3;
  iterator __begin3;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *__range3;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> knownQtVersions;
  string local_88;
  allocator<char> local_51;
  string local_50;
  uint local_2c;
  IntegerVersion local_28;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *target_local;
  uint uStack_10;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> res;
  
  local_28.Major = 0;
  local_28.Minor = 0;
  local_20 = target;
  cmQtAutoGen::IntegerVersion::IntegerVersion(&local_28);
  this = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"QT_MAJOR_VERSION",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"",
             (allocator<char> *)
             ((long)&knownQtVersions.
                     super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  input = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(this,&local_50,&local_88);
  local_2c = CharPtrToUInt(input);
  std::pair<cmQtAutoGen::IntegerVersion,_unsigned_int>::
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int,_true>
            ((pair<cmQtAutoGen::IntegerVersion,_unsigned_int> *)((long)&target_local + 4),&local_28,
             &local_2c);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&knownQtVersions.
                     super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  GetKnownQtVersions((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                      *)&__range3,local_20);
  bVar3 = std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::
          empty((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *
                )&__range3);
  vVar2 = stack0xffffffffffffffec;
  if (!bVar3) {
    if (res.first.Major == 0) {
      pvVar4 = std::
               vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::at
                         ((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                           *)&__range3,0);
      vVar2 = *pvVar4;
    }
    else {
      __end3 = std::
               vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::
               begin((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                      *)&__range3);
      it = (IntegerVersion)
           std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::
           end((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *)
               &__range3);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmQtAutoGen::IntegerVersion_*,_std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>_>
                                         *)&it), vVar2 = stack0xffffffffffffffec, bVar3) {
        pIVar5 = __gnu_cxx::
                 __normal_iterator<cmQtAutoGen::IntegerVersion_*,_std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>_>
                 ::operator*(&__end3);
        vVar2.Major = pIVar5->Major;
        vVar2.Minor = pIVar5->Minor;
        if (vVar2.Major == res.first.Major) break;
        __gnu_cxx::
        __normal_iterator<cmQtAutoGen::IntegerVersion_*,_std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>_>
        ::operator++(&__end3);
      }
    }
  }
  stack0xffffffffffffffec = vVar2;
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::~vector
            ((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *)
             &__range3);
  pVar1.second = res.first.Major;
  pVar1.first.Major = target_local._4_4_;
  pVar1.first.Minor = uStack_10;
  return pVar1;
}

Assistant:

std::pair<cmQtAutoGen::IntegerVersion, unsigned int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget const* target)
{
  std::pair<IntegerVersion, unsigned int> res(
    IntegerVersion(),
    CharPtrToUInt(target->GetLinkInterfaceDependentStringProperty(
      "QT_MAJOR_VERSION", "")));

  auto knownQtVersions = GetKnownQtVersions(target);
  if (!knownQtVersions.empty()) {
    if (res.second == 0) {
      // No specific version was requested by the target:
      // Use highest known Qt version.
      res.first = knownQtVersions.at(0);
    } else {
      // Pick a version from the known versions:
      for (auto it : knownQtVersions) {
        if (it.Major == res.second) {
          res.first = it;
          break;
        }
      }
    }
  }
  return res;
}